

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectMaterial(XFileParser *this,Material *pMaterial)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_> *pvVar4;
  Logger *this_00;
  ai_real aVar5;
  aiColor4D aVar6;
  TexEntry local_1b8;
  undefined1 local_190 [8];
  string texname_1;
  undefined1 local_148 [8];
  string texname;
  string local_120;
  undefined1 local_100 [8];
  string objectName;
  undefined1 local_d8 [7];
  bool running;
  undefined1 local_cc [20];
  char *pcStack_b8;
  string local_b0;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  string matName;
  Material *pMaterial_local;
  XFileParser *this_local;
  
  matName.field_2._8_8_ = pMaterial;
  std::__cxx11::string::string((string *)local_38);
  readHeadOfDataObject(this,(string *)local_38);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"material",&local_89);
    to_string<unsigned_int>(&local_b0,this->mLineNumber);
    std::operator+(&local_68,&local_88,&local_b0);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  std::__cxx11::string::operator=((string *)matName.field_2._8_8_,(string *)local_38);
  *(undefined1 *)(matName.field_2._8_8_ + 0x20) = 0;
  aVar6 = ReadRGBA(this);
  pcStack_b8 = aVar6._8_8_;
  local_cc._12_8_ = aVar6._0_8_;
  *(undefined8 *)(matName.field_2._8_8_ + 0x24) = local_cc._12_8_;
  *(char **)(matName.field_2._8_8_ + 0x2c) = pcStack_b8;
  aVar5 = ReadFloat(this);
  *(ai_real *)(matName.field_2._8_8_ + 0x34) = aVar5;
  ReadRGB((XFileParser *)local_cc);
  aiColor3D::operator=((aiColor3D *)(matName.field_2._8_8_ + 0x38),(aiColor3D *)local_cc);
  ReadRGB((XFileParser *)local_d8);
  aiColor3D::operator=((aiColor3D *)(matName.field_2._8_8_ + 0x44),(aiColor3D *)local_d8);
  objectName.field_2._M_local_buf[0xf] = '\x01';
  do {
    if ((objectName.field_2._M_local_buf[0xf] & 1U) == 0) break;
    GetNextToken_abi_cxx11_((string *)local_100,this);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_120,"Unexpected end of file while parsing mesh material",
                 (allocator *)(texname.field_2._M_local_buf + 0xf));
      ThrowException(this,&local_120);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_100,"}");
    if (bVar1) {
      texname.field_2._8_4_ = 3;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_100,"TextureFilename");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_100,"TextureFileName"), bVar1)) {
        std::__cxx11::string::string((string *)local_148);
        ParseDataObjectTextureFilename(this,(string *)local_148);
        pvVar4 = (vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_> *)
                 (matName.field_2._8_8_ + 0x50);
        XFile::TexEntry::TexEntry
                  ((TexEntry *)((long)&texname_1.field_2 + 8),(string *)local_148,false);
        std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::push_back
                  (pvVar4,(value_type *)((long)&texname_1.field_2 + 8));
        XFile::TexEntry::~TexEntry((TexEntry *)((long)&texname_1.field_2 + 8));
        std::__cxx11::string::~string((string *)local_148);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_100,"NormalmapFilename");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_100,"NormalmapFileName"), bVar1)) {
          std::__cxx11::string::string((string *)local_190);
          ParseDataObjectTextureFilename(this,(string *)local_190);
          pvVar4 = (vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_> *)
                   (matName.field_2._8_8_ + 0x50);
          XFile::TexEntry::TexEntry(&local_1b8,(string *)local_190,true);
          std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::push_back
                    (pvVar4,&local_1b8);
          XFile::TexEntry::~TexEntry(&local_1b8);
          std::__cxx11::string::~string((string *)local_190);
        }
        else {
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,"Unknown data object in material in x file");
          ParseUnknownDataObject(this);
        }
      }
      texname.field_2._8_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_100);
  } while (texname.field_2._8_4_ == 0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XFileParser::ParseDataObjectMaterial( Material* pMaterial)
{
    std::string matName;
    readHeadOfDataObject( &matName);
    if( matName.empty())
        matName = std::string( "material") + to_string( mLineNumber );
    pMaterial->mName = matName;
    pMaterial->mIsReference = false;

    // read material values
    pMaterial->mDiffuse = ReadRGBA();
    pMaterial->mSpecularExponent = ReadFloat();
    pMaterial->mSpecular = ReadRGB();
    pMaterial->mEmissive = ReadRGB();

    // read other data objects
    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if( objectName.size() == 0)
            ThrowException( "Unexpected end of file while parsing mesh material");
        else
        if( objectName == "}")
            break; // material finished
        else
        if( objectName == "TextureFilename" || objectName == "TextureFileName")
        {
            // some exporters write "TextureFileName" instead.
            std::string texname;
            ParseDataObjectTextureFilename( texname);
            pMaterial->mTextures.push_back( TexEntry( texname));
        } else
        if( objectName == "NormalmapFilename" || objectName == "NormalmapFileName")
        {
            // one exporter writes out the normal map in a separate filename tag
            std::string texname;
            ParseDataObjectTextureFilename( texname);
            pMaterial->mTextures.push_back( TexEntry( texname, true));
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in material in x file");
            ParseUnknownDataObject();
        }
    }
}